

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool anon_unknown.dwarf_8f1b29::InitializeSymbolTable
               (TString *builtIns,int version,EProfile profile,SpvVersion *spvVersion,
               EShLanguage language,EShSource source,TInfoSink *infoSink,TSymbolTable *symbolTable)

{
  SpvVersion spvVersion_00;
  int iVar1;
  TParseContextBase *__p;
  type pTVar2;
  pointer pTVar3;
  char *pcVar4;
  undefined1 local_d40 [8];
  TInputScanner input;
  size_type local_cd8;
  size_t builtInLengths [2];
  char *builtInShaders [2];
  undefined1 local_cb0 [8];
  TScanContext scanContext;
  string local_c58;
  undefined1 local_c38 [8];
  TPpContext ppContext;
  ForbidIncluder includer;
  string local_858;
  undefined8 local_838;
  undefined8 local_830;
  undefined4 local_828;
  unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_> local_820
  ;
  unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
  parseContext;
  TIntermediate intermediate;
  EShSource source_local;
  EShLanguage language_local;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TString *builtIns_local;
  
  glslang::TIntermediate::TIntermediate((TIntermediate *)&parseContext,language,version,profile);
  glslang::TIntermediate::setSource((TIntermediate *)&parseContext,source);
  local_838._0_4_ = spvVersion->spv;
  local_838._4_4_ = spvVersion->vulkanGlsl;
  local_830._0_4_ = spvVersion->vulkan;
  local_830._4_4_ = spvVersion->openGl;
  local_828 = *(undefined4 *)&spvVersion->vulkanRelaxed;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"",
             (allocator<char> *)((long)&includer.super_Includer._vptr_Includer + 7));
  spvVersion_00.vulkan = (undefined4)local_830;
  spvVersion_00.openGl = local_830._4_4_;
  spvVersion_00.spv = (undefined4)local_838;
  spvVersion_00.vulkanGlsl = local_838._4_4_;
  spvVersion_00._16_4_ = local_828;
  __p = CreateParseContext(symbolTable,(TIntermediate *)&parseContext,version,profile,source,
                           language,infoSink,spvVersion_00,true,EShMsgDefault,true,&local_858);
  std::unique_ptr<glslang::TParseContextBase,std::default_delete<glslang::TParseContextBase>>::
  unique_ptr<std::default_delete<glslang::TParseContextBase>,void>
            ((unique_ptr<glslang::TParseContextBase,std::default_delete<glslang::TParseContextBase>>
              *)&local_820,__p);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&includer.super_Includer._vptr_Includer + 7));
  glslang::TShader::ForbidIncluder::ForbidIncluder
            ((ForbidIncluder *)&ppContext.disableEscapeSequences);
  pTVar2 = std::
           unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
           ::operator*(&local_820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c58,"",(allocator<char> *)&scanContext.field_0x4f);
  glslang::TPpContext::TPpContext
            ((TPpContext *)local_c38,pTVar2,&local_c58,(Includer *)&ppContext.disableEscapeSequences
            );
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator((allocator<char> *)&scanContext.field_0x4f);
  pTVar2 = std::
           unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
           ::operator*(&local_820);
  glslang::TScanContext::TScanContext((TScanContext *)local_cb0,pTVar2);
  pTVar3 = std::
           unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
           ::operator->(&local_820);
  glslang::TParseContextBase::setScanContext(pTVar3,(TScanContext *)local_cb0);
  pTVar3 = std::
           unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
           ::operator->(&local_820);
  glslang::TParseContextBase::setPpContext(pTVar3,(TPpContext *)local_c38);
  glslang::TSymbolTable::push(symbolTable);
  builtInLengths[1] =
       (size_t)std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (builtIns);
  local_cd8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                        (builtIns);
  if (local_cd8 == 0) {
    builtIns_local._7_1_ = true;
    input._92_4_ = 1;
  }
  else {
    glslang::TInputScanner::TInputScanner
              ((TInputScanner *)local_d40,1,(char **)(builtInLengths + 1),&local_cd8,(char **)0x0,0,
               0,false);
    pTVar3 = std::
             unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>
             ::operator->(&local_820);
    iVar1 = (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x3b])
                      (pTVar3,local_c38,local_d40,0);
    builtIns_local._7_1_ = (((byte)iVar1 ^ 0xff) & 1) == 0;
    if (!builtIns_local._7_1_) {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixInternalError,"Unable to parse built-ins");
      pcVar4 = glslang::TInfoSinkBase::c_str(&infoSink->info);
      printf("Unable to parse built-ins\n%s\n",pcVar4);
      printf("%s\n",builtInLengths[1]);
    }
    input._92_4_ = 1;
    glslang::TInputScanner::~TInputScanner((TInputScanner *)local_d40);
  }
  glslang::TScanContext::~TScanContext((TScanContext *)local_cb0);
  glslang::TPpContext::~TPpContext((TPpContext *)local_c38);
  glslang::TShader::ForbidIncluder::~ForbidIncluder
            ((ForbidIncluder *)&ppContext.disableEscapeSequences);
  std::unique_ptr<glslang::TParseContextBase,_std::default_delete<glslang::TParseContextBase>_>::
  ~unique_ptr(&local_820);
  glslang::TIntermediate::~TIntermediate((TIntermediate *)&parseContext);
  return builtIns_local._7_1_;
}

Assistant:

bool InitializeSymbolTable(const TString& builtIns, int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language,
                           EShSource source, TInfoSink& infoSink, TSymbolTable& symbolTable)
{
    TIntermediate intermediate(language, version, profile);

    intermediate.setSource(source);

    std::unique_ptr<TParseContextBase> parseContext(CreateParseContext(symbolTable, intermediate, version, profile, source,
                                                                       language, infoSink, spvVersion, true, EShMsgDefault,
                                                                       true));

    TShader::ForbidIncluder includer;
    TPpContext ppContext(*parseContext, "", includer);
    TScanContext scanContext(*parseContext);
    parseContext->setScanContext(&scanContext);
    parseContext->setPpContext(&ppContext);

    //
    // Push the symbol table to give it an initial scope.  This
    // push should not have a corresponding pop, so that built-ins
    // are preserved, and the test for an empty table fails.
    //

    symbolTable.push();

    const char* builtInShaders[2];
    size_t builtInLengths[2];
    builtInShaders[0] = builtIns.c_str();
    builtInLengths[0] = builtIns.size();

    if (builtInLengths[0] == 0)
        return true;

    TInputScanner input(1, builtInShaders, builtInLengths);
    if (! parseContext->parseShaderStrings(ppContext, input) != 0) {
        infoSink.info.message(EPrefixInternalError, "Unable to parse built-ins");
        printf("Unable to parse built-ins\n%s\n", infoSink.info.c_str());
        printf("%s\n", builtInShaders[0]);

        return false;
    }

    return true;
}